

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
GdlAttrValueSpec::PrettyPrintAttach
          (GdlAttrValueSpec *this,GrcManager *pcman,ostream *strmOut,bool fXml)

{
  bool bVar1;
  Symbol this_00;
  ulong uVar2;
  ostream *poVar3;
  byte in_CL;
  ostream *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  int nValue;
  Symbol psym;
  GdlLookupExpression *pexpLookup;
  GrcSymbolTableEntry *in_stack_fffffffffffffeb0;
  GrcSymbolTableEntry *in_stack_fffffffffffffec0;
  GdlLookupExpression *local_108;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [16];
  GrcSymbolTableEntry *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  GrcSymbolTableEntry *in_stack_ffffffffffffff58;
  int local_88 [5];
  allocator local_71;
  string local_70 [32];
  string local_50 [32];
  Symbol local_30;
  GdlLookupExpression *local_28;
  byte local_19;
  ostream *local_18;
  undefined8 local_10;
  
  local_19 = in_CL & 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (((*(byte *)(in_RDI + 0x44) & 1) == 0) ||
     ((bVar1 = GrcSymbolTableEntry::IsAttachAtField(in_stack_fffffffffffffec0), !bVar1 &&
      (bVar1 = GrcSymbolTableEntry::IsAttachWithField(in_stack_fffffffffffffec0), !bVar1)))) {
    bVar1 = GrcSymbolTableEntry::IsAttachOffsetField(in_stack_fffffffffffffeb0);
    if ((!bVar1) ||
       ((uVar2 = (**(code **)(**(long **)(in_RDI + 0x38) + 0x38))
                           (*(long **)(in_RDI + 0x38),local_88,0), (uVar2 & 1) == 0 ||
        (local_88[0] != 0)))) {
      poVar3 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c8,"attach",&local_c9);
      GrcSymbolTableEntry::FullAbbrevOmit(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      std::operator<<(poVar3,(string *)&stack0xffffffffffffff58);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
      std::__cxx11::string::~string(local_c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_c9);
      poVar3 = std::operator<<(local_18," ");
      GrcSymbolTableEntry::FullAbbrev_abi_cxx11_(in_stack_ffffffffffffff48);
      poVar3 = std::operator<<(poVar3,local_f0);
      std::operator<<(poVar3," ");
      std::__cxx11::string::~string(local_f0);
      (**(code **)(**(long **)(in_RDI + 0x38) + 0xe8))
                (*(long **)(in_RDI + 0x38),local_10,local_18,local_19 & 1,0);
      std::operator<<(local_18,"; ");
    }
  }
  else {
    bVar1 = GrcSymbolTableEntry::IsAttachXField(in_stack_fffffffffffffec0);
    if (bVar1) {
      bVar1 = GrcSymbolTableEntry::IsAttachAtField(in_stack_fffffffffffffec0);
      if (bVar1) {
        std::operator<<(local_18,"at = ");
      }
      else {
        std::operator<<(local_18,"with = ");
      }
      if (*(long *)(in_RDI + 0x38) == 0) {
        local_108 = (GdlLookupExpression *)0x0;
      }
      else {
        local_108 = (GdlLookupExpression *)
                    __dynamic_cast(*(long *)(in_RDI + 0x38),&GdlExpression::typeinfo,
                                   &GdlLookupExpression::typeinfo,0);
      }
      local_28 = local_108;
      if (local_108 == (GdlLookupExpression *)0x0) {
        (**(code **)(**(long **)(in_RDI + 0x38) + 0xe8))
                  (*(long **)(in_RDI + 0x38),local_10,local_18,local_19 & 1,0);
      }
      else {
        this_00 = GdlLookupExpression::Name(local_108);
        local_30 = GrcSymbolTableEntry::ParentSymbol(this_00);
        poVar3 = local_18;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_70,"attach",&local_71);
        GrcSymbolTableEntry::FullAbbrevOmit(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
        std::operator<<(poVar3,local_50);
        std::__cxx11::string::~string(local_50);
        std::__cxx11::string::~string(local_70);
        std::allocator<char>::~allocator((allocator<char> *)&local_71);
      }
      std::operator<<(local_18,"; ");
    }
  }
  return;
}

Assistant:

void GdlAttrValueSpec::PrettyPrintAttach(GrcManager * pcman, std::ostream & strmOut, bool fXml)
{
	if (m_fFlattened
		&& (m_psymName->IsAttachAtField() || m_psymName->IsAttachWithField()))
	{
		// A single statement like "attach.at = apt" has been translated into
		// "attach.at.x = apt.x, attach.at.y = apt.y, attach.at.xoffset = apt.xoffset,
		// attach.at.yoffset = apt.yoffset". Just print out one of these, say, the x.
		if (m_psymName->IsAttachXField())
		{
			if (m_psymName->IsAttachAtField())
				strmOut << "at = ";
			else
				strmOut << "with = ";
			GdlLookupExpression * pexpLookup = dynamic_cast<GdlLookupExpression *>(m_pexpValue);
			if (pexpLookup)
			{
				Symbol psym = pexpLookup->Name()->ParentSymbol();
				strmOut << psym->FullAbbrevOmit("attach");
			}
			else
				// strange...
				m_pexpValue->PrettyPrint(pcman, strmOut, fXml);
			strmOut << "; ";
		}
		return;
	}
	
	if (m_psymName->IsAttachOffsetField())
	{
		int nValue;
		if (m_pexpValue->ResolveToInteger(&nValue, false) && nValue == 0)
			// Don't bother putting out something like attach.at.xoffset = 0.
			return;
	}

	strmOut << m_psymName->FullAbbrevOmit("attach");
	strmOut << " " << m_psymOperator->FullAbbrev() << " ";
	m_pexpValue->PrettyPrint(pcman, strmOut, fXml);
	strmOut << "; ";
}